

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenCallRef(BinaryenModuleRef module,BinaryenExpressionRef target,
               BinaryenExpressionRef *operands,BinaryenIndex numOperands,BinaryenType type,
               bool isReturn)

{
  CallRef *pCVar1;
  Type local_80;
  Builder local_78 [3];
  BinaryenExpressionRef local_60;
  uint local_54;
  undefined1 local_50 [4];
  BinaryenIndex i;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  bool isReturn_local;
  BinaryenType type_local;
  BinaryenIndex numOperands_local;
  BinaryenExpressionRef *operands_local;
  BinaryenExpressionRef target_local;
  BinaryenModuleRef module_local;
  
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = isReturn;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_50);
  for (local_54 = 0; local_54 < numOperands; local_54 = local_54 + 1) {
    local_60 = operands[local_54];
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_50,&local_60
              );
  }
  wasm::Builder::Builder(local_78,module);
  wasm::Type::Type(&local_80,type);
  pCVar1 = wasm::Builder::
           makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                     (local_78,target,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_50,
                      local_80,(bool)(args.
                                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1))
  ;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_50);
  return (BinaryenExpressionRef)pCVar1;
}

Assistant:

BinaryenExpressionRef BinaryenCallRef(BinaryenModuleRef module,
                                      BinaryenExpressionRef target,
                                      BinaryenExpressionRef* operands,
                                      BinaryenIndex numOperands,
                                      BinaryenType type,
                                      bool isReturn) {
  std::vector<Expression*> args;
  for (BinaryenIndex i = 0; i < numOperands; i++) {
    args.push_back((Expression*)operands[i]);
  }
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeCallRef((Expression*)target, args, Type(type), isReturn));
}